

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

deInt32 tcu::getPositionOfIEEEFloatWithoutDenormals(float x)

{
  deInt32 dVar1;
  int iVar2;
  
  if ((x == 0.0) && (!NAN(x))) {
    return 0;
  }
  if (x < 0.0) {
    dVar1 = getPositionOfIEEEFloatWithoutDenormals(-x);
    return -dVar1;
  }
  iVar2 = 0;
  if (((uint)x & 0x7fffff) == 0) {
    iVar2 = (int)x + -0x7fffff;
  }
  if (((uint)x & 0x7f800000) != 0) {
    iVar2 = (int)x + -0x7fffff;
  }
  return iVar2;
}

Assistant:

static deInt32 getPositionOfIEEEFloatWithoutDenormals (float x)
{
	DE_ASSERT(!deIsNaN(x)); // not sane

	if (x == 0.0f)
		return 0;
	else if (x < 0.0f)
		return -getPositionOfIEEEFloatWithoutDenormals(-x);
	else
	{
		DE_ASSERT(x > 0.0f);

		const tcu::Float32 f(x);

		if (f.isDenorm())
		{
			// Denorms are flushed to zero
			return 0;
		}
		else
		{
			// sign is 0, and it's a normal number. Natural position is its bit
			// pattern but since we've collapsed the denorms, we must remove
			// the gap here too to keep the float enumeration continuous.
			//
			// Denormals occupy one exponent pattern. Removing one from
			// exponent should to the trick. Add one since the removed range
			// contained one representable value, 0.
			return (deInt32)(f.bits() - (1u << 23u) + 1u);
		}
	}
}